

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaTest.cpp
# Opt level: O1

void __thiscall Arena_Guard_Test::TestBody(Arena_Guard_Test *this)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ptr;
  bool bVar2;
  internal iVar3;
  size_t needed;
  pointer *__ptr;
  char *in_R9;
  pointer *__ptr_6;
  char *p;
  ulong uVar4;
  bool bVar5;
  Guard g3;
  Guard g4;
  Guard noop;
  Guard g1;
  Arena arena;
  Guard g5;
  AssertionResult gtest_ar__2;
  Guard g6;
  Guard emptyGuard;
  Guard emptyGuard2;
  undefined1 local_108 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  undefined1 local_f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  string local_e8;
  undefined1 local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  Arena local_b8;
  Guard local_98;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  internal local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  Guard local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  Guard local_58;
  AssertHelper local_48;
  Guard local_40;
  
  memt::Arena::Arena(&local_b8);
  local_e8._M_string_length = (size_type)local_b8._blocks._block._position;
  if (local_b8._blocks._block._position == local_b8._blocks._block._begin) {
    if (local_b8._blocks._block._previous == (Block *)0x0) {
      local_e8._M_string_length = 0;
    }
    else {
      local_e8._M_string_length = (size_type)(local_b8._blocks._block._previous)->_position;
    }
  }
  local_e8._M_dataplus._M_p = (pointer)&local_b8;
  memt::Arena::Guard::~Guard((Guard *)&local_e8);
  if (local_b8._blocks._block._position == local_b8._blocks._block._begin) {
    if (local_b8._blocks._block._previous == (Block *)0x0) {
      local_e8._M_string_length = 0;
    }
    else {
      local_e8._M_string_length = (size_type)(local_b8._blocks._block._previous)->_position;
    }
    local_58.mPosition = local_b8._blocks._block._position;
    if (local_b8._blocks._block._position == local_b8._blocks._block._begin) {
      if (local_b8._blocks._block._previous == (Block *)0x0) {
        local_58.mPosition =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      else {
        local_58.mPosition = (local_b8._blocks._block._previous)->_position;
      }
    }
  }
  else {
    local_e8._M_string_length = (size_type)local_b8._blocks._block._position;
    local_58.mPosition = local_b8._blocks._block._position;
  }
  local_e8._M_dataplus._M_p = (pointer)&local_b8;
  local_58.mArena = &local_b8;
  memt::Arena::Guard::~Guard(&local_58);
  memt::Arena::Guard::~Guard((Guard *)&local_e8);
  local_58.mPosition = local_b8._blocks._block._position;
  if (local_b8._blocks._block._position == local_b8._blocks._block._begin) {
    if (local_b8._blocks._block._previous == (Block *)0x0) {
      local_58.mPosition = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    else {
      local_58.mPosition = (local_b8._blocks._block._previous)->_position;
    }
  }
  local_58.mArena = &local_b8;
  if ((ulong)((long)local_b8._blocks._block._end - (long)local_b8._blocks._block._position) < 10000)
  {
    memt::Arena::growCapacity(&local_b8,10000);
  }
  pcVar1 = local_b8._blocks._block._position;
  if (&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)local_b8._blocks._block._position + 0x2700))->field_2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._blocks._block._begin) {
    local_b8._blocks._block._position =
         (char *)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)local_b8._blocks._block._position + 0x2700))->field_2;
    memt::Arena::freeTopFromOldBlock(&local_b8,pcVar1);
  }
  local_40.mPosition = local_b8._blocks._block._position;
  if (local_b8._blocks._block._position == local_b8._blocks._block._begin) {
    if (local_b8._blocks._block._previous == (Block *)0x0) {
      local_40.mPosition = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    else {
      local_40.mPosition = (local_b8._blocks._block._previous)->_position;
    }
  }
  bVar5 = false;
  uVar4 = 0;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_40.mArena = &local_b8;
  do {
    if (uVar4 == 3) {
      if (local_b8._blocks._block._end == local_b8._blocks._block._position) {
        memt::Arena::growCapacity(&local_b8,1);
      }
      local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_b8._blocks._block._position;
      local_b8._blocks._block._position = (char *)((long)local_b8._blocks._block._position + 8);
    }
    local_e8._M_string_length = (size_type)local_b8._blocks._block._position;
    if (local_b8._blocks._block._position == local_b8._blocks._block._begin) {
      if (local_b8._blocks._block._previous == (Block *)0x0) {
        local_e8._M_string_length = 0;
      }
      else {
        local_e8._M_string_length = (size_type)(local_b8._blocks._block._previous)->_position;
      }
    }
    local_e8._M_dataplus._M_p = (pointer)&local_b8;
    memt::Arena::Guard::~Guard((Guard *)&local_e8);
    local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_b8._blocks._block._position;
    if (local_b8._blocks._block._position == local_b8._blocks._block._begin) {
      if (local_b8._blocks._block._previous == (Block *)0x0) {
        local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      else {
        local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_b8._blocks._block._previous)->_position;
      }
      if (local_b8._blocks._block._position == local_b8._blocks._block._begin) {
        if (local_b8._blocks._block._previous == (Block *)0x0) {
          local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        else {
          local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_b8._blocks._block._previous)->_position;
        }
      }
    }
    else {
      local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_b8._blocks._block._position;
    }
    local_108 = (undefined1  [8])&local_b8;
    local_c8 = (undefined1  [8])&local_b8;
    if (local_b8._blocks._block._end == local_b8._blocks._block._position) {
      memt::Arena::growCapacity(&local_b8,1);
    }
    pcVar1 = local_b8._blocks._block._position;
    local_b8._blocks._block._position = (char *)((long)local_b8._blocks._block._position + 8);
    bVar2 = memt::Arena::fromArena(&local_b8,pcVar1);
    local_f8[0] = bVar2;
    local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar2) {
      testing::Message::Message((Message *)&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_e8,(internal *)local_f8,(AssertionResult *)"arena.fromArena(tmp)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                 ,0xfe,local_e8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.mArena !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_98.mArena + 8))();
      }
      if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_f0,local_f0);
      }
      if (bVar2) goto LAB_00110746;
      memt::Arena::Guard::~Guard((Guard *)local_108);
LAB_00110b4e:
      memt::Arena::Guard::~Guard((Guard *)local_c8);
      break;
    }
LAB_00110746:
    local_108 = (undefined1  [8])0x0;
    memt::Arena::Guard::~Guard((Guard *)local_108);
    bVar2 = memt::Arena::fromArena(&local_b8,pcVar1);
    local_108[0] = bVar2;
    local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar2) {
      testing::Message::Message((Message *)local_f8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_e8,(internal *)local_108,(AssertionResult *)"arena.fromArena(tmp)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                 ,0x101,local_e8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )local_f8 !=
          (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )0x0) {
        (**(code **)(*(size_type *)local_f8 + 8))();
      }
      if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_100,local_100);
      }
      if (!bVar2) goto LAB_00110b4e;
    }
    local_70.mPosition = local_b8._blocks._block._position;
    if (local_b8._blocks._block._position == local_b8._blocks._block._begin) {
      if (local_b8._blocks._block._previous == (Block *)0x0) {
        local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      else {
        local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_b8._blocks._block._previous)->_position;
      }
      if (local_b8._blocks._block._position == local_b8._blocks._block._begin) {
        if (local_b8._blocks._block._previous == (Block *)0x0) {
          local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        else {
          local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_b8._blocks._block._previous)->_position;
        }
        goto LAB_00110843;
      }
      local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_b8._blocks._block._position;
      local_98.mPosition = local_b8._blocks._block._position;
LAB_001108b7:
      if (local_b8._blocks._block._position == local_b8._blocks._block._begin) {
        if (local_b8._blocks._block._previous == (Block *)0x0) {
          local_70.mPosition =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        else {
          local_70.mPosition = (local_b8._blocks._block._previous)->_position;
        }
      }
    }
    else {
      local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_b8._blocks._block._position;
      local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_b8._blocks._block._position;
LAB_00110843:
      if (local_b8._blocks._block._position == local_b8._blocks._block._begin) {
        if (local_b8._blocks._block._previous == (Block *)0x0) {
          local_98.mPosition =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        else {
          local_98.mPosition =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_b8._blocks._block._previous)->_position;
        }
        goto LAB_001108b7;
      }
      local_98.mPosition = local_b8._blocks._block._position;
    }
    local_70.mArena = (Arena *)0x0;
    local_108 = (undefined1  [8])0x0;
    local_f8 = (undefined1  [8])&local_b8;
    local_98.mArena = &local_b8;
    iVar3 = (internal)memt::Arena::fromArena(&local_b8,pcVar1);
    local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_80[0] = iVar3;
    if (!(bool)iVar3) {
      testing::Message::Message((Message *)&local_88);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_e8,local_80,(AssertionResult *)"arena.fromArena(tmp)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                 ,0x108,local_e8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_78,local_78);
    }
    memt::Arena::Guard::~Guard(&local_70);
    memt::Arena::Guard::~Guard(&local_98);
    memt::Arena::Guard::~Guard((Guard *)local_f8);
    memt::Arena::Guard::~Guard((Guard *)local_108);
    memt::Arena::Guard::~Guard((Guard *)local_c8);
    if (!(bool)iVar3) break;
    bVar2 = memt::Arena::fromArena(&local_b8,pcVar1);
    local_c8[0] = !bVar2;
    local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar2) {
      testing::Message::Message((Message *)local_108);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_e8,(internal *)local_c8,(AssertionResult *)"arena.fromArena(tmp)","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_f8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                 ,0x10a,local_e8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_f8,(Message *)local_108);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if (local_108 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_108 + 8))();
      }
      if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_c0,local_c0);
      }
      break;
    }
    needed = memt::MemoryBlocks::getMemoryUse((MemoryBlocks *)&local_b8);
    if (((ulong)((long)local_b8._blocks._block._end - (long)local_b8._blocks._block._position) <=
         needed - 1) &&
       ((needed != 0 ||
        (needed = 1, local_b8._blocks._block._end == local_b8._blocks._block._position)))) {
      memt::Arena::growCapacity(&local_b8,needed);
    }
    local_b8._blocks._block._position =
         (char *)((long)&((_Alloc_hider *)local_b8._blocks._block._position)->_M_p +
                 (needed + 7 & 0xfffffffffffffff8));
    bVar5 = 4 < uVar4;
    uVar4 = uVar4 + 1;
  } while (uVar4 != 6);
  ptr = local_60;
  if (bVar5) {
    local_c8[0] = local_60 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      testing::Message::Message((Message *)local_108);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_e8,(internal *)local_c8,(AssertionResult *)"fromIteration3 != 0","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_f8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                 ,0x110,local_e8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_f8,(Message *)local_108);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )local_108 !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(size_type *)local_108 + 8))();
      }
      if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_c0,local_c0);
      }
    }
    else {
      bVar5 = memt::Arena::fromArena(&local_b8,local_60);
      local_c8[0] = bVar5;
      local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!bVar5) {
        testing::Message::Message((Message *)local_108);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_e8,(internal *)local_c8,
                   (AssertionResult *)"arena.fromArena(fromIteration3)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_f8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                   ,0x111,local_e8._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_f8,(Message *)local_108);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if (local_108 != (undefined1  [8])0x0) {
          (**(code **)(*(size_type *)local_108 + 8))();
        }
        if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_c0,local_c0);
        }
        if (!bVar5) goto LAB_00110d2c;
      }
      if ((ulong)((long)ptr - (long)local_b8._blocks._block._begin) <
          (ulong)((long)local_b8._blocks._block._end - (long)local_b8._blocks._block._begin)) {
        local_b8._blocks._block._position = (char *)ptr;
      }
      else {
        memt::Arena::freeAndAllAfterFromOldBlock(&local_b8,ptr);
      }
    }
  }
LAB_00110d2c:
  memt::Arena::Guard::~Guard(&local_40);
  memt::Arena::Guard::~Guard(&local_58);
  memt::Arena::~Arena(&local_b8);
  return;
}

Assistant:

TEST(Arena, Guard) {
  memt::Arena arena;
  {
	memt::Arena::Guard noop(arena); // no-op guard
  }

  {
	// double no-op guard
	memt::Arena::Guard guard1(arena);
	memt::Arena::Guard guard2(arena);
  }


  // guard for empty arena with no allocations on it ever
  memt::Arena::Guard emptyGuard(arena);
  arena.freeTop(arena.alloc(10000));
  // guard for empty arena which has allocated some memory previously
  memt::Arena::Guard emptyGuard2(arena);
  // memory use is exponential in number of iterations so do not
  // increase too much.
  void* fromIteration3 = 0;
  for (size_t i = 0; i < 6u; ++i) {
	if (i == 3)
	  fromIteration3 = arena.alloc(1);
	{
	  memt::Arena::Guard noop(arena); // no-op guard
	}
	void* tmp;
	{
	  memt::Arena::Guard g1(arena);
	  {
		memt::Arena::Guard g2(arena);
		tmp = arena.alloc(1);
  	    ASSERT_TRUE(arena.fromArena(tmp));
		g2.release();
	  }
      ASSERT_TRUE(arena.fromArena(tmp)); // released guard did not free
	  memt::Arena::Guard g3(arena);
	  memt::Arena::Guard g4(arena);
	  memt::Arena::Guard g5(arena);
	  memt::Arena::Guard g6(arena);
	  g6.release();
	  g3.release();
	  ASSERT_TRUE(arena.fromArena(tmp));
	}
	ASSERT_FALSE(arena.fromArena(tmp)); // freed despite some guards freed
	// allocate enough memory to force a new block of backing memory
	// inside the arena.
	arena.alloc(arena.getMemoryUse());
  }
  // free a middle allocation to force some blocks to go away
  ASSERT_TRUE(fromIteration3 != 0);
  ASSERT_TRUE(arena.fromArena(fromIteration3));
  arena.freeAndAllAfter(fromIteration3);
}